

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

uint8 * __thiscall
caffe::SolverState::InternalSerializeWithCachedSizesToArray
          (SolverState *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  int iVar2;
  string *psVar3;
  void *pvVar4;
  bool bVar5;
  byte *pbVar6;
  Type *this_00;
  uint8 *puVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int index;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 2) != 0) {
    uVar9 = (ulong)this->iter_;
    pbVar6 = target + 1;
    *target = '\b';
    uVar11 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar6 = (byte)uVar9 | 0x80;
        uVar11 = uVar9 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar5 = 0x3fff < uVar9;
        uVar9 = uVar11;
      } while (bVar5);
    }
    *pbVar6 = (byte)uVar11;
    target = pbVar6 + 1;
  }
  if ((uVar1 & 1) != 0) {
    psVar3 = (this->learned_net_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.SolverState.learned_net");
    psVar3 = (this->learned_net_).ptr_;
    *target = 0x12;
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar3,target + 1);
  }
  iVar2 = (this->history_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    index = 0;
    do {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&(this->history_).super_RepeatedPtrFieldBase,index);
      *target = 0x1a;
      pbVar6 = target + 1;
      uVar10 = this_00->_cached_size_;
      uVar8 = uVar10;
      if (0x7f < uVar10) {
        do {
          *pbVar6 = (byte)uVar10 | 0x80;
          uVar8 = uVar10 >> 7;
          pbVar6 = pbVar6 + 1;
          bVar5 = 0x3fff < uVar10;
          uVar10 = uVar8;
        } while (bVar5);
      }
      *pbVar6 = (byte)uVar8;
      target = BlobProto::InternalSerializeWithCachedSizesToArray(this_00,false,pbVar6 + 1);
      index = index + 1;
    } while (index != iVar2);
  }
  if ((uVar1 & 4) != 0) {
    uVar9 = (ulong)this->current_step_;
    pbVar6 = target + 1;
    *target = 0x20;
    uVar11 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar6 = (byte)uVar9 | 0x80;
        uVar11 = uVar9 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar5 = 0x3fff < uVar9;
        uVar9 = uVar11;
      } while (bVar5);
    }
    *pbVar6 = (byte)uVar11;
    target = pbVar6 + 1;
  }
  pvVar4 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar4 & 1) != 0) {
    puVar7 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe),target);
    return puVar7;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* SolverState::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.SolverState)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 iter = 1;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1, this->iter(), target);
  }

  // optional string learned_net = 2;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->learned_net().data(), this->learned_net().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverState.learned_net");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->learned_net(), target);
  }

  // repeated .caffe.BlobProto history = 3;
  for (unsigned int i = 0, n = this->history_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        3, this->history(i), deterministic, target);
  }

  // optional int32 current_step = 4 [default = 0];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(4, this->current_step(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.SolverState)
  return target;
}